

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::SpellGroup(Map *this,Character *from,unsigned_short spell_id)

{
  undefined2 uVar1;
  World *pWVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  vector<Character_*,_std::allocator<Character_*>_> *this_00;
  reference ppCVar8;
  mapped_type *pmVar9;
  int *piVar10;
  short *psVar11;
  reference ppCVar12;
  reference ppCVar13;
  byte local_252;
  byte local_235;
  byte local_234;
  byte local_232;
  byte local_1fa;
  byte local_1db;
  byte local_1da;
  byte local_1d9;
  Character *character_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> *__range1_1;
  Character *local_1a0;
  Character *character;
  iterator __end2;
  iterator __begin2;
  list<Character_*,_std::allocator<Character_*>_> *__range2;
  int local_178;
  allocator local_171;
  key_type local_170;
  int local_150;
  byte local_14b;
  byte local_14a;
  allocator local_149;
  key_type local_148;
  int local_124;
  int local_120;
  allocator local_119;
  key_type local_118;
  int local_f8;
  int local_f4;
  int hpgain;
  int displayhp_1;
  Character *member;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  PacketBuilder builder;
  set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> in_range;
  allocator local_51;
  key_type local_50;
  int local_2c;
  ESF_Data *pEStack_28;
  int displayhp;
  ESF_Data *spell;
  Character *pCStack_18;
  unsigned_short spell_id_local;
  Character *from_local;
  Map *this_local;
  
  spell._6_2_ = spell_id;
  pCStack_18 = from;
  from_local = (Character *)this;
  pEStack_28 = ESF::Get(from->world->esf,(uint)spell_id);
  bVar4 = ESF_Data_Base::operator_cast_to_bool((ESF_Data_Base *)pEStack_28);
  if ((((bVar4) && (pEStack_28->type == Heal)) && (pCStack_18->party != (Party *)0x0)) &&
     (pEStack_28->tp <= pCStack_18->tp)) {
    pCStack_18->tp = pCStack_18->tp - pEStack_28->tp;
    local_2c = (int)pEStack_28->hp;
    bVar5 = Character::CanInteractCombat(pCStack_18);
    bVar3 = false;
    bVar4 = false;
    local_1d9 = 0;
    if (!bVar5) {
      bVar5 = Character::CanInteractPKCombat(pCStack_18);
      local_1da = 0;
      if (bVar5) {
        local_1db = 1;
        if ((pCStack_18->map->pk & 1U) == 0) {
          pWVar2 = this->world;
          std::allocator<char>::allocator();
          bVar3 = true;
          std::__cxx11::string::string((string *)&local_50,"GlobalPK",&local_51);
          bVar4 = true;
          pmVar9 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                   ::operator[](&(pWVar2->config).
                                 super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                ,&local_50);
          bVar5 = util::variant::operator_cast_to_bool(pmVar9);
          local_1fa = 0;
          if (bVar5) {
            bVar5 = World::PKExcept(this->world,(int)this->id);
            local_1fa = bVar5 ^ 0xff;
          }
          local_1db = local_1fa;
        }
        local_1da = local_1db;
      }
      local_1d9 = local_1da ^ 0xff;
    }
    if (bVar4) {
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (bVar3) {
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
    }
    if ((local_1d9 & 1) != 0) {
      in_range._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      piVar10 = std::min<int>(&local_2c,
                              (int *)((long)&in_range._M_t._M_impl.super__Rb_tree_header.
                                             _M_node_count + 4));
      local_2c = *piVar10;
    }
    std::set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_>::set
              ((set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> *)
               &builder.add_size);
    sVar7 = std::vector<Character_*,_std::allocator<Character_*>_>::size
                      (&pCStack_18->party->members);
    PacketBuilder::PacketBuilder
              ((PacketBuilder *)&__range1,PACKET_SPELL,PACKET_TARGET_GROUP,sVar7 * 10 + 8);
    PacketBuilder::AddShort((PacketBuilder *)&__range1,spell._6_2_);
    iVar6 = Character::PlayerID(pCStack_18);
    PacketBuilder::AddShort((PacketBuilder *)&__range1,(unsigned_short)iVar6);
    PacketBuilder::AddShort((PacketBuilder *)&__range1,pCStack_18->tp);
    PacketBuilder::AddShort((PacketBuilder *)&__range1,(unsigned_short)local_2c);
    this_00 = &pCStack_18->party->members;
    __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(this_00);
    member = (Character *)std::vector<Character_*,_std::allocator<Character_*>_>::end(this_00);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                       *)&member), bVar4) {
      ppCVar8 = __gnu_cxx::
                __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                ::operator*(&__end1);
      _hpgain = *ppCVar8;
      if (_hpgain->map == pCStack_18->map) {
        local_f4 = (int)pEStack_28->hp;
        local_f8 = (int)pEStack_28->hp;
        pWVar2 = this->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_118,"LimitDamage",&local_119);
        pmVar9 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar2->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,&local_118);
        bVar4 = util::variant::operator_cast_to_bool(pmVar9);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
        if (bVar4) {
          local_120 = (int)_hpgain->maxhp - (int)_hpgain->hp;
          piVar10 = std::min<int>(&local_f8,&local_120);
          local_f8 = *piVar10;
        }
        local_124 = 0;
        piVar10 = std::max<int>(&local_f8,&local_124);
        local_f8 = *piVar10;
        local_14a = 0;
        local_14b = 0;
        bVar4 = Character::CanInteractCombat(pCStack_18);
        local_232 = 0;
        if (!bVar4) {
          bVar4 = Character::CanInteractPKCombat(pCStack_18);
          local_234 = 0;
          if (bVar4) {
            local_235 = 1;
            if ((pCStack_18->map->pk & 1U) == 0) {
              pWVar2 = this->world;
              std::allocator<char>::allocator();
              local_14a = 1;
              std::__cxx11::string::string((string *)&local_148,"GlobalPK",&local_149);
              local_14b = 1;
              pmVar9 = std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                       ::operator[](&(pWVar2->config).
                                     super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                    ,&local_148);
              bVar4 = util::variant::operator_cast_to_bool(pmVar9);
              local_252 = 0;
              if (bVar4) {
                bVar4 = World::PKExcept(this->world,(int)this->id);
                local_252 = bVar4 ^ 0xff;
              }
              local_235 = local_252;
            }
            local_234 = local_235;
          }
          local_232 = local_234 ^ 0xff;
        }
        if ((local_14b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_148);
        }
        if ((local_14a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_149);
        }
        if ((local_232 & 1) != 0) {
          local_150 = 1;
          piVar10 = std::min<int>(&local_f8,&local_150);
          local_f8 = *piVar10;
        }
        uVar1 = _hpgain->hp;
        _hpgain->hp = uVar1 + (short)local_f8;
        pWVar2 = this->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_170,"LimitDamage",&local_171);
        pmVar9 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar2->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,&local_170);
        bVar4 = util::variant::operator_cast_to_bool(pmVar9);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
        if (((bVar4 ^ 0xffU) & 1) != 0) {
          psVar11 = std::min<short>(&_hpgain->hp,&_hpgain->maxhp);
          _hpgain->hp = *psVar11;
        }
        PacketBuilder::AddByte((PacketBuilder *)&__range1,0xff);
        PacketBuilder::AddByte((PacketBuilder *)&__range1,0xff);
        PacketBuilder::AddByte((PacketBuilder *)&__range1,0xff);
        PacketBuilder::AddByte((PacketBuilder *)&__range1,0xff);
        PacketBuilder::AddByte((PacketBuilder *)&__range1,0xff);
        iVar6 = Character::PlayerID(_hpgain);
        PacketBuilder::AddShort((PacketBuilder *)&__range1,(unsigned_short)iVar6);
        local_178 = (int)(((double)(int)_hpgain->hp / (double)(int)_hpgain->maxhp) * 100.0);
        __range2._4_4_ = 0;
        __range2._0_4_ = 100;
        iVar6 = util::clamp<int>(&local_178,(int *)((long)&__range2 + 4),(int *)&__range2);
        PacketBuilder::AddChar((PacketBuilder *)&__range1,(uchar)iVar6);
        PacketBuilder::AddShort((PacketBuilder *)&__range1,_hpgain->hp);
        __end2 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin
                           (&this->characters);
        character = (Character *)
                    std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end
                              (&this->characters);
        while (bVar4 = std::operator!=(&__end2,(_Self *)&character), bVar4) {
          ppCVar12 = std::_List_iterator<Character_*>::operator*(&__end2);
          local_1a0 = *ppCVar12;
          bVar4 = Character::InRange(_hpgain,local_1a0);
          if (bVar4) {
            std::set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_>::insert
                      ((set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> *)
                       &builder.add_size,&local_1a0);
          }
          std::_List_iterator<Character_*>::operator++(&__end2);
        }
      }
      __gnu_cxx::
      __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
      operator++(&__end1);
    }
    __end1_1 = std::set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_>::begin
                         ((set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> *)
                          &builder.add_size);
    character_1 = (Character *)
                  std::set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_>::end
                            ((set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_>
                              *)&builder.add_size);
    while (bVar4 = std::operator!=(&__end1_1,(_Self *)&character_1), bVar4) {
      ppCVar13 = std::_Rb_tree_const_iterator<Character_*>::operator*(&__end1_1);
      Character::Send(*ppCVar13,(PacketBuilder *)&__range1);
      std::_Rb_tree_const_iterator<Character_*>::operator++(&__end1_1);
    }
    PacketBuilder::~PacketBuilder((PacketBuilder *)&__range1);
    std::set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_>::~set
              ((set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> *)
               &builder.add_size);
  }
  return;
}

Assistant:

void Map::SpellGroup(Character *from, unsigned short spell_id)
{
	const ESF_Data &spell = from->world->esf->Get(spell_id);

	if (!spell || spell.type != ESF::Heal || !from->party || from->tp < spell.tp)
		return;

	from->tp -= spell.tp;

	int displayhp = spell.hp;

	if (!from->CanInteractCombat() && !(from->CanInteractPKCombat() && (from->map->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id)))))
	{
		displayhp = std::min(displayhp, 1);
	}

	std::set<Character *> in_range;

	PacketBuilder builder(PACKET_SPELL, PACKET_TARGET_GROUP, 8 + from->party->members.size() * 10);
	builder.AddShort(spell_id);
	builder.AddShort(from->PlayerID());
	builder.AddShort(from->tp);
	builder.AddShort(displayhp);

	UTIL_FOREACH(from->party->members, member)
	{
		if (member->map != from->map)
			continue;

		int displayhp = spell.hp;
		int hpgain = spell.hp;

		if (this->world->config["LimitDamage"])
			hpgain = std::min(hpgain, member->maxhp - member->hp);

		hpgain = std::max(hpgain, 0);

		if (!from->CanInteractCombat() && !(from->CanInteractPKCombat() && (from->map->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id)))))
			hpgain = std::min(hpgain, 1);

		member->hp += hpgain;

		if (!this->world->config["LimitDamage"])
			member->hp = std::min(member->hp, member->maxhp);

		// wat?
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);

		builder.AddShort(member->PlayerID());
		builder.AddChar(util::clamp<int>(double(member->hp) / double(member->maxhp) * 100.0, 0, 100));
		builder.AddShort(member->hp);

		UTIL_FOREACH(this->characters, character)
		{
			if (member->InRange(character))
				in_range.insert(character);
		}
	}

	UTIL_FOREACH(in_range, character)
	{
		character->Send(builder);
	}
}